

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

void vkt::sr::(anonymous_namespace)::MatrixCaseUtils::writeMatrixConstructor<2,4>
               (ostream *str,Matrix<float,_4,_2> *m)

{
  Matrix<float,_4,_2> *pMVar1;
  ostream *poVar2;
  float *pfVar3;
  int precision;
  string local_40;
  int local_20;
  int local_1c;
  int rowNdx;
  int colNdx;
  Matrix<float,_4,_2> *m_local;
  ostream *str_local;
  
  _rowNdx = m;
  m_local = (Matrix<float,_4,_2> *)str;
  poVar2 = std::operator<<(str,"mat");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
  poVar2 = std::operator<<(poVar2,"x");
  std::ostream::operator<<(poVar2,4);
  std::operator<<((ostream *)m_local,"(");
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      if ((0 < local_20) || (0 < local_1c)) {
        std::operator<<((ostream *)m_local,", ");
      }
      pMVar1 = m_local;
      pfVar3 = tcu::Matrix<float,_4,_2>::operator()(_rowNdx,local_20,local_1c);
      de::floatToString_abi_cxx11_(&local_40,(de *)0x1,*pfVar3,precision);
      std::operator<<((ostream *)pMVar1,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  std::operator<<((ostream *)m_local,")");
  return;
}

Assistant:

void writeMatrixConstructor (std::ostream& str, const tcu::Matrix<float, Rows, Cols>& m)
{
	if (Rows == Cols)
		str << "mat" << Cols;
	else
		str << "mat" << Cols << "x" << Rows;

	str << "(";
	for (int colNdx = 0; colNdx < Cols; colNdx++)
	{
		for (int rowNdx = 0; rowNdx < Rows; rowNdx++)
		{
			if (rowNdx > 0 || colNdx > 0)
				str << ", ";
			str << de::floatToString(m(rowNdx, colNdx), 1);
		}
	}
	str << ")";
}